

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.hpp
# Opt level: O3

bool __thiscall Quad::intersect(Quad *this,Ray *ray,float *result)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  float fVar4;
  
  fVar4 = -(ray->origin).y / (ray->dir).y;
  if ((0.0 < fVar4) &&
     (iVar2 = -(uint)(ABS((ray->origin).z + (ray->dir).z * fVar4) < 0.5),
     iVar3 = -(uint)(ABS((ray->origin).x + (ray->dir).x * fVar4) < 0.5), auVar1._4_4_ = iVar2,
     auVar1._0_4_ = iVar2, auVar1._8_4_ = iVar3, auVar1._12_4_ = iVar3,
     iVar2 = movmskpd(in_EAX,auVar1), iVar2 == 3)) {
    *result = fVar4;
    return true;
  }
  return false;
}

Assistant:

bool intersect(const Ray& ray, float& result) const
	{
		float t = -ray.origin.y / ray.dir.y;
		point p = ray.atParam(t);
		if (t>0 && p.x>-0.5 && p.x<0.5 && p.z>-0.5 && p.z<0.5)
		{
			result = t;
			return true;
		}
		return false;
	}